

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O2

bool poll_stall_information(StallState *state)

{
  int iVar1;
  int32_t iVar2;
  FILE *pFVar3;
  char *pcVar4;
  int *piVar5;
  longlong lVar6;
  ulonglong uVar7;
  bool bVar8;
  timespec ts;
  
  pFVar3 = fopen("/proc/meminfo","r");
  if (pFVar3 == (FILE *)0x0) {
    if (Global::control_block != 0) {
      *(undefined4 *)(Global::control_block + 0xc8c) = 0xffffffff;
    }
LAB_001296e4:
    state->dirty_pages_mib = -1;
  }
  else {
    bVar8 = false;
    while (pcVar4 = fgets((char *)&ts,0x400,pFVar3), pcVar4 != (char *)0x0) {
      iVar1 = bcmp(&ts,"Dirty:",6);
      if (iVar1 == 0) {
        piVar5 = __errno_location();
        *piVar5 = 0;
        lVar6 = strtoll((char *)((long)&ts.tv_sec + 6),(char **)0x0,10);
        if (*piVar5 == 0) {
          iVar2 = (int32_t)(lVar6 / 0x400);
          state->dirty_pages_mib = iVar2;
          bVar8 = true;
          if (Global::control_block != 0) {
            *(int32_t *)(Global::control_block + 0xc8c) = iVar2;
          }
        }
      }
    }
    if (Global::control_block != 0 && !bVar8) {
      *(undefined4 *)(Global::control_block + 0xc8c) = 0xffffffff;
    }
    fclose(pFVar3);
    if (!bVar8) goto LAB_001296e4;
  }
  pFVar3 = fopen("/proc/pressure/io","r");
  if (pFVar3 != (FILE *)0x0) {
    pcVar4 = fgets((char *)&ts,0x400,pFVar3);
    if (((pcVar4 == (char *)0x0) || (iVar1 = bcmp(&ts,"some ",5), iVar1 != 0)) ||
       (pcVar4 = strstr((char *)&ts,"total="), pcVar4 == (char *)0x0)) {
      fclose(pFVar3);
    }
    else {
      piVar5 = __errno_location();
      *piVar5 = 0;
      uVar7 = strtoull(pcVar4 + 6,(char **)0x0,10);
      state->io_stalled_us = uVar7;
      iVar1 = *piVar5;
      fclose(pFVar3);
      if (iVar1 == 0) goto LAB_00129741;
    }
  }
  state->io_stalled_us = -1;
LAB_00129741:
  ts.tv_sec = 0;
  ts.tv_nsec = 0;
  iVar1 = clock_gettime(1,(timespec *)&ts);
  if (iVar1 == 0) {
    state->timestamp_ns = ts.tv_sec * 1000000000 + ts.tv_nsec;
  }
  return iVar1 == 0;
}

Assistant:

static bool poll_stall_information(StallState &state)
{
	if (!get_dirty_page_info(state))
		state.dirty_pages_mib = -1;
	if (!get_stall_info("/proc/pressure/io", state.io_stalled_us))
		state.io_stalled_us = -1;

	timespec ts = {};
	if (clock_gettime(CLOCK_MONOTONIC, &ts) != 0)
		return false;
	state.timestamp_ns = ts.tv_sec * 1000000000ll + ts.tv_nsec;
	return true;
}